

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O2

void duckdb::HeapScatterArrayVector
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  Vector *this;
  LogicalType *other;
  idx_t iVar4;
  idx_t iVar5;
  NestedValidity *this_00;
  data_ptr_t pdVar6;
  long lVar7;
  SelectionVector *pSVar8;
  idx_t iVar9;
  idx_t i;
  data_ptr_t pdVar10;
  ulong uVar11;
  idx_t vcount_00;
  LogicalType child_type;
  UnifiedVectorFormat vdata;
  NestedValidity array_parent_validity;
  UnifiedVectorFormat child_vdata;
  idx_t array_entry_sizes [2048];
  data_ptr_t array_entry_locations [2048];
  idx_t local_8150;
  undefined4 local_8144;
  idx_t local_8140;
  optional_ptr<duckdb::NestedValidity,_true> local_8138;
  long local_8130;
  ulong local_8128;
  SelectionVector *local_8120;
  idx_t local_8118;
  ulong local_8110;
  LogicalType local_8108;
  UnifiedVectorFormat local_80f0;
  NestedValidity local_80a8;
  UnifiedVectorFormat local_8080;
  idx_t local_8038 [2048];
  data_ptr_t local_4038 [2049];
  
  local_8138.ptr = parent_validity.ptr;
  local_8120 = sel;
  local_8118 = ser_count;
  this = ArrayVector::GetEntry(v);
  local_8140 = ArrayType::GetSize(&v->type);
  other = ArrayType::GetChildType(&v->type);
  LogicalType::LogicalType(&local_8108,other);
  iVar4 = GetTypeIdSize(local_8108.physical_type_);
  bVar3 = TypeIsConstantSize(local_8108.physical_type_);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_80f0);
  Vector::ToUnifiedFormat(v,vcount,&local_80f0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_8080);
  iVar5 = ArrayVector::GetTotalSize(v);
  Vector::ToUnifiedFormat(this,iVar5,&local_8080);
  local_8128 = local_8140 + 7 >> 3;
  local_8130 = local_8140 * 8;
  for (iVar5 = 0; iVar5 != local_8118; iVar5 = iVar5 + 1) {
    iVar9 = iVar5;
    if (local_8120->sel_vector != (sel_t *)0x0) {
      iVar9 = (idx_t)local_8120->sel_vector[iVar5];
    }
    uVar11 = iVar9 + offset;
    if ((local_80f0.sel)->sel_vector != (sel_t *)0x0) {
      uVar11 = (ulong)(local_80f0.sel)->sel_vector[uVar11];
    }
    if (((local_8138.ptr != (NestedValidity *)0x0) &&
        (local_80f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
         (unsigned_long *)0x0)) &&
       ((local_80f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar11 >> 6]
         >> (uVar11 & 0x3f) & 1) == 0)) {
      this_00 = optional_ptr<duckdb::NestedValidity,_true>::operator->(&local_8138);
      NestedValidity::SetInvalid(this_00,iVar5);
    }
    uVar2 = local_8128;
    pdVar10 = key_locations[iVar5];
    switchD_016d4fed::default(pdVar10,0xff,local_8128);
    key_locations[iVar5] = key_locations[iVar5] + uVar2;
    NestedValidity::NestedValidity(&local_80a8,pdVar10);
    if (bVar3) {
      pdVar10 = (data_ptr_t)0x0;
    }
    else {
      pdVar10 = key_locations[iVar5];
      key_locations[iVar5] = pdVar10 + local_8130;
    }
    local_8150 = uVar11 * local_8140;
    iVar9 = local_8140;
    while (iVar9 != 0) {
      vcount_00 = 0x800;
      if (iVar9 < 0x800) {
        vcount_00 = iVar9;
      }
      local_8110 = iVar9;
      if (bVar3) {
        pdVar6 = key_locations[iVar5];
        for (iVar9 = 0; vcount_00 != iVar9; iVar9 = iVar9 + 1) {
          local_4038[iVar9] = pdVar6;
          pdVar6 = pdVar6 + iVar4;
        }
        key_locations[iVar5] = pdVar6;
      }
      else {
        local_8144 = 0;
        ::std::__fill_n_a<unsigned_long*,unsigned_long,int>(local_8038,vcount_00,&local_8144);
        pSVar8 = FlatVector::IncrementalSelectionVector();
        RowOperations::ComputeEntrySizes(this,local_8038,vcount_00,vcount_00,pSVar8,local_8150);
        for (lVar7 = 0; vcount_00 * 8 - lVar7 != 0; lVar7 = lVar7 + 8) {
          pdVar6 = key_locations[iVar5];
          *(data_ptr_t *)((long)local_4038 + lVar7) = pdVar6;
          lVar1 = *(long *)((long)local_8038 + lVar7);
          key_locations[iVar5] = pdVar6 + lVar1;
          *(long *)(pdVar10 + lVar7) = lVar1;
        }
        pdVar10 = pdVar10 + lVar7;
      }
      iVar9 = ArrayVector::GetTotalSize(v);
      pSVar8 = FlatVector::IncrementalSelectionVector();
      RowOperations::HeapScatter(this,iVar9,pSVar8,vcount_00,local_4038,&local_80a8,local_8150);
      local_8150 = local_8150 + vcount_00;
      local_80a8.list_validity_offset = local_80a8.list_validity_offset + vcount_00;
      iVar9 = local_8110 - vcount_00;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_8080);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_80f0);
  LogicalType::~LogicalType(&local_8108);
  return;
}

Assistant:

static void HeapScatterArrayVector(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                   data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity,
                                   idx_t offset) {

	auto &child_vector = ArrayVector::GetEntry(v);
	auto array_size = ArrayType::GetSize(v.GetType());
	auto child_type = ArrayType::GetChildType(v.GetType());
	auto child_type_size = GetTypeIdSize(child_type.InternalType());
	auto child_type_is_var_size = !TypeIsConstantSize(child_type.InternalType());

	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(vcount, vdata);

	UnifiedVectorFormat child_vdata;
	child_vector.ToUnifiedFormat(ArrayVector::GetTotalSize(v), child_vdata);

	data_ptr_t array_entry_locations[STANDARD_VECTOR_SIZE];
	idx_t array_entry_sizes[STANDARD_VECTOR_SIZE];

	// array must have a validitymask for its elements
	auto array_validitymask_size = (array_size + 7) / 8;

	for (idx_t i = 0; i < ser_count; i++) {
		// Set if the whole array itself is null in the parent entry
		auto source_idx = vdata.sel->get_index(sel.get_index(i) + offset);
		if (parent_validity && !vdata.validity.RowIsValid(source_idx)) {
			parent_validity->SetInvalid(i);
		}

		// Now we can serialize the array itself
		// Every array starts with a validity mask for the children
		data_ptr_t array_validitymask_location = key_locations[i];
		memset(array_validitymask_location, -1, array_validitymask_size);
		key_locations[i] += array_validitymask_size;

		NestedValidity array_parent_validity(array_validitymask_location);

		// If the array contains variable size entries, we reserve spaces for them here
		data_ptr_t var_entry_size_ptr = nullptr;
		if (child_type_is_var_size) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += array_size * sizeof(idx_t);
		}

		// Then comes the elements
		auto array_start = source_idx * array_size;
		auto elem_remaining = array_size;

		while (elem_remaining > 0) {
			// the array elements can span multiple vectors, so we divide it into chunks
			auto chunk_size = MinValue(static_cast<idx_t>(STANDARD_VECTOR_SIZE), elem_remaining);

			// Setup the locations for the elements
			if (child_type_is_var_size) {
				// The elements are variable sized
				std::fill_n(array_entry_sizes, chunk_size, 0);
				RowOperations::ComputeEntrySizes(child_vector, array_entry_sizes, chunk_size, chunk_size,
				                                 *FlatVector::IncrementalSelectionVector(), array_start);
				for (idx_t elem_idx = 0; elem_idx < chunk_size; elem_idx++) {
					array_entry_locations[elem_idx] = key_locations[i];
					key_locations[i] += array_entry_sizes[elem_idx];

					// Now store the size of the entry
					Store<idx_t>(array_entry_sizes[elem_idx], var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			} else {
				// The elements are constant sized
				for (idx_t elem_idx = 0; elem_idx < chunk_size; elem_idx++) {
					array_entry_locations[elem_idx] = key_locations[i];
					key_locations[i] += child_type_size;
				}
			}

			RowOperations::HeapScatter(child_vector, ArrayVector::GetTotalSize(v),
			                           *FlatVector::IncrementalSelectionVector(), chunk_size, array_entry_locations,
			                           &array_parent_validity, array_start);

			// update for next iteration
			elem_remaining -= chunk_size;
			array_start += chunk_size;
			array_parent_validity.OffsetListBy(chunk_size);
		}
	}
}